

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

string * __thiscall embree::ParseLocation::str_abi_cxx11_(ParseLocation *this)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *str;
  string *this_00;
  string local_c8 [32];
  string local_a8 [16];
  longlong in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [54];
  allocator local_32;
  undefined1 local_31;
  undefined8 local_20;
  string *local_18;
  size_type local_10;
  string *local_8;
  
  local_31 = 0;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"unknown",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_RSI);
    std::__cxx11::string::operator=((string *)this_00,(string *)peVar2);
  }
  if (-1 < (long)(in_RSI->field_2)._M_allocated_capacity) {
    local_10 = (in_RSI->field_2)._M_allocated_capacity;
    local_8 = local_88;
    std::__cxx11::to_string(in_stack_ffffffffffffff68);
    std::operator+((char *)this_00,in_RSI);
    std::__cxx11::string::operator+=((string *)this_00,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  if ((-1 < (long)(in_RSI->field_2)._M_allocated_capacity) &&
     (-1 < *(long *)((long)&in_RSI->field_2 + 8))) {
    local_20 = *(undefined8 *)((long)&in_RSI->field_2 + 8);
    local_18 = local_c8;
    std::__cxx11::to_string(in_stack_ffffffffffffff68);
    std::operator+((char *)this_00,in_RSI);
    std::__cxx11::string::operator+=((string *)this_00,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
  }
  return in_RDI;
}

Assistant:

std::string str() const
    {
      std::string str = "unknown";
      if (fileName) str = *fileName;
      if (lineNumber >= 0) str += " line " + toString(lineNumber);
      if (lineNumber >= 0 && colNumber >= 0) str += " character " + toString(colNumber);
      return str;
    }